

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directive.cpp
# Opt level: O0

void __thiscall ast::Dir_equ::Dir_equ(Dir_equ *this,Symbol *symbol,Expression *value,Location left)

{
  Location l;
  Expression *pEVar1;
  Symbol *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  Symbol *local_50;
  Symbol *s;
  char *local_38;
  int iStack_30;
  int iStack_2c;
  int local_28;
  undefined4 uStack_24;
  Expression *local_20;
  Expression *value_local;
  Symbol *symbol_local;
  Dir_equ *this_local;
  
  l = left;
  local_28 = left.last_column;
  uStack_24 = left._20_4_;
  local_38 = left.unit;
  iStack_30 = left.line;
  iStack_2c = left.first_column;
  local_20 = value;
  value_local = (Expression *)symbol;
  symbol_local = (Symbol *)this;
  Directive::Directive(&this->super_Directive,l);
  (this->super_Directive).super_Statement._vptr_Statement = (_func_int **)&PTR__Dir_equ_0017ea08;
  this->symbol = (Symbol *)value_local;
  (this->super_Directive).super_Statement.section_index =
       *(uint *)(Sections::current_section + 0x20);
  (this->super_Directive).super_Statement.section_offset =
       *(uint *)(Sections::current_section + 0x30);
  (this->super_Directive).super_Statement.size_in_memory = 0;
  Symbol::set_properties
            ((Symbol *)value_local,UNDEFINED,*(uint *)(Sections::current_section + 0x20),local_20);
  std::__cxx11::string::string((string *)&local_70,(string *)&(value_local->location).last_column);
  this_00 = Symbols::search(&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  pEVar1 = value_local;
  local_50 = this_00;
  if (this_00 == (Symbol *)0x0) {
    Symbols::add((Symbol *)value_local);
  }
  else if (this_00->value_expression == (Expression *)0x0) {
    Symbol::set_properties(this_00,UNDEFINED,*(uint *)(Sections::current_section + 0x20),local_20);
    pEVar1 = value_local;
    if (value_local != (Expression *)0x0) {
      Symbol::~Symbol((Symbol *)value_local);
      operator_delete(pEVar1);
    }
  }
  else {
    std::operator+(&local_b0,"Symbol \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(value_local->location).last_column);
    std::operator+(&local_90,&local_b0,"\" is already defined");
    error_report((Location *)pEVar1,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  return;
}

Assistant:

Dir_equ::Dir_equ(Symbol *symbol, Expression *value, Location left) :
	Directive {left}, symbol {symbol}
{
	section_index = Sections::current_section->number;	/* Um simbolo equ não pertence a uma secção ... */
	section_offset = Sections::current_section->content_size;
	size_in_memory = 0;
	symbol->set_properties(UNDEFINED, Sections::current_section->number, value);
	Symbol *s = Symbols::search(symbol->name);
	if (s == nullptr) {
		Symbols::add(symbol);
	}
	else if (s->value_expression == nullptr) {
		s->set_properties(UNDEFINED, Sections::current_section->number, value);
		delete symbol;
	}
	else
		error_report(&symbol->location, "Symbol \"" + symbol->name + "\" is already defined");
}